

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

void mpp_buffer_group_dump(MppBufferGroupImpl *group,char *caller)

{
  list_head *plVar1;
  MppBufLogs *pMVar2;
  MppBufLog *pMVar3;
  RK_U16 RVar4;
  ushort uVar5;
  list_head *plVar6;
  char *pcVar7;
  
  _mpp_log_l(4,"mpp_buffer","\ndumping buffer group %p id %d from %s\n",(char *)0x0,group,
             (ulong)group->group_id,caller);
  _mpp_log_l(4,"mpp_buffer","mode %s\n",(char *)0x0,mode2str[group->mode]);
  _mpp_log_l(4,"mpp_buffer","type %s\n",(char *)0x0,type2str[group->type]);
  _mpp_log_l(4,"mpp_buffer","limit size %d count %d\n",(char *)0x0,group->limit_size,
             (ulong)(uint)group->limit_count);
  _mpp_log_l(4,"mpp_buffer","used buffer count %d\n",(char *)0x0,(ulong)(uint)group->count_used);
  plVar6 = (group->list_used).next;
  while (plVar6 != &group->list_used) {
    plVar1 = plVar6->next;
    dump_buffer_info((MppBufferImpl *)&plVar6[-0xd].prev);
    plVar6 = plVar1;
  }
  _mpp_log_l(4,"mpp_buffer","unused buffer count %d\n",(char *)0x0,(ulong)(uint)group->count_unused)
  ;
  plVar6 = (group->list_unused).next;
  while (plVar6 != &group->list_unused) {
    plVar1 = plVar6->next;
    dump_buffer_info((MppBufferImpl *)&plVar6[-0xd].prev);
    plVar6 = plVar1;
  }
  pMVar2 = group->logs;
  if (pMVar2 != (MppBufLogs *)0x0) {
    RVar4 = pMVar2->log_count;
    while (RVar4 != 0) {
      pMVar3 = pMVar2->logs;
      uVar5 = pMVar2->log_read;
      pcVar7 = ops2str[pMVar3[uVar5].ops];
      if (pMVar3[uVar5].buffer_id < 0) {
        _mpp_log_l(4,"mpp_buffer","group %3d ops %s\n",(char *)0x0,(ulong)pMVar3[uVar5].group_id,
                   pcVar7,caller);
      }
      else {
        _mpp_log_l(4,"mpp_buffer","group %3d buffer %4d ops %s ref_count %d caller %s\n",(char *)0x0
                   ,(ulong)pMVar3[uVar5].group_id,(ulong)(uint)pMVar3[uVar5].buffer_id,pcVar7,
                   pMVar3[uVar5].ref_count,pMVar3[uVar5].caller);
        caller = pcVar7;
      }
      uVar5 = pMVar2->log_read + 1;
      if (pMVar2->max_count <= uVar5) {
        uVar5 = 0;
      }
      pMVar2->log_read = uVar5;
      RVar4 = pMVar2->log_count - 1;
      pMVar2->log_count = RVar4;
    }
    if (pMVar2->log_read != pMVar2->log_write) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "logs->log_read == logs->log_write","buf_logs_dump",
                 CONCAT44((int)((ulong)caller >> 0x20),0xd3));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
  }
  return;
}

Assistant:

void mpp_buffer_group_dump(MppBufferGroupImpl *group, const char *caller)
{
    mpp_log("\ndumping buffer group %p id %d from %s\n", group,
            group->group_id, caller);
    mpp_log("mode %s\n", mode2str[group->mode]);
    mpp_log("type %s\n", type2str[group->type]);
    mpp_log("limit size %d count %d\n", group->limit_size, group->limit_count);

    mpp_log("used buffer count %d\n", group->count_used);

    MppBufferImpl *pos, *n;
    list_for_each_entry_safe(pos, n, &group->list_used, MppBufferImpl, list_status) {
        dump_buffer_info(pos);
    }

    mpp_log("unused buffer count %d\n", group->count_unused);
    list_for_each_entry_safe(pos, n, &group->list_unused, MppBufferImpl, list_status) {
        dump_buffer_info(pos);
    }

    if (group->logs)
        buf_logs_dump(group->logs);
}